

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlDocPtr xmlReadFd(int fd,char *URL,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  ctxt = xmlNewParserCtxt();
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    pxVar1 = (xmlDocPtr)0x0;
  }
  else {
    xmlCtxtUseOptions(ctxt,options);
    pxVar1 = (xmlDocPtr)0x0;
    input = xmlCtxtNewInputFromFd(ctxt,URL,fd,encoding,0);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

xmlDocPtr
xmlReadFd(int fd, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromFd(ctxt, URL, fd, encoding, 0);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}